

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

void __thiscall
Clasp::SharedContext::simplify(SharedContext *this,size_type trailStart,bool shuffle)

{
  ConstraintDB *db;
  Literal p;
  uint uVar1;
  uint uVar2;
  Solver *pSVar3;
  Constraint *pCVar4;
  pointer ppSVar5;
  Solver *pSVar6;
  pointer ppCVar7;
  int iVar8;
  ulong uVar9;
  Constraint **ppCVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  
  if ((SUB41(this->share_,3) >> 1 & ((uint)this->share_ & 0x3fe) != 0) == 0) {
    uVar9 = (ulong)trailStart;
    pSVar3 = *(this->solvers_).ebo_.buf;
    if ((trailStart < (pSVar3->assign_).trail.ebo_.size) &&
       ((pSVar3->assign_).trail.ebo_.size != trailStart)) {
      do {
        p.rep_ = (pSVar3->assign_).trail.ebo_.buf[uVar9].rep_;
        if (p.rep_ >> 1 < (this->btig_).graph_.ebo_.size) {
          ShortImplicationsGraph::removeTrue(&this->btig_,*(this->solvers_).ebo_.buf,p);
        }
        uVar14 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar14;
      } while (uVar14 != (pSVar3->assign_).trail.ebo_.size);
    }
  }
  pSVar3 = *(this->solvers_).ebo_.buf;
  db = &pSVar3->constraints_;
  if ((((uint)this->share_ & 0x3ff) == 1) || (pSVar3->dbIdx_ == 0)) {
    simplifyDB<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
              (pSVar3,db,shuffle);
  }
  else {
    uVar9 = (ulong)(pSVar3->constraints_).ebo_.size;
    if (uVar9 == 0) {
      iVar11 = 0;
    }
    else {
      uVar13 = 0;
      iVar11 = 0;
      do {
        pCVar4 = (db->ebo_).buf[uVar13];
        iVar8 = (*pCVar4->_vptr_Constraint[4])(pCVar4,*(this->solvers_).ebo_.buf,shuffle);
        if ((char)iVar8 != '\0') {
          (*pCVar4->_vptr_Constraint[5])(pCVar4,*(this->solvers_).ebo_.buf,0);
          (db->ebo_).buf[uVar13] = (Constraint *)0x0;
          iVar11 = iVar11 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    if (iVar11 != 0) {
      uVar14 = (this->solvers_).ebo_.size;
      if (uVar14 != 1) {
        ppSVar5 = (this->solvers_).ebo_.buf;
        uVar1 = (pSVar3->constraints_).ebo_.size;
        uVar12 = 1;
        do {
          pSVar6 = ppSVar5[uVar12];
          uVar2 = pSVar6->dbIdx_;
          if (uVar1 < uVar2) {
            Potassco::fail(-1,"void Clasp::SharedContext::simplify(LitVec::size_type, bool)",0x47a,
                           "x.dbIdx_ <= db.size()","Invalid DB idx!",0);
          }
          iVar8 = iVar11;
          if (uVar2 == uVar1) {
LAB_0016303c:
            pSVar6->dbIdx_ = uVar2 - iVar8;
          }
          else if ((ulong)uVar2 != 0) {
            lVar15 = 0;
            iVar8 = 0;
            do {
              iVar8 = iVar8 + (uint)(*(long *)((long)(db->ebo_).buf + lVar15) == 0);
              lVar15 = lVar15 + 8;
            } while ((ulong)uVar2 * 8 - lVar15 != 0);
            goto LAB_0016303c;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar14);
      }
      ppCVar7 = (pSVar3->constraints_).ebo_.buf;
      ppCVar10 = std::__remove_if<Clasp::Constraint**,__gnu_cxx::__ops::_Iter_pred<Clasp::IsNull>>
                           (ppCVar7,ppCVar7 + (pSVar3->constraints_).ebo_.size);
      uVar14 = (pSVar3->constraints_).ebo_.size;
      (pSVar3->constraints_).ebo_.size =
           uVar14 - (int)((long)(pSVar3->constraints_).ebo_.buf +
                          ((ulong)uVar14 * 8 - (long)ppCVar10) >> 3);
    }
  }
  (*(this->solvers_).ebo_.buf)->dbIdx_ = (pSVar3->constraints_).ebo_.size;
  return;
}

Assistant:

void SharedContext::simplify(LitVec::size_type trailStart, bool shuffle) {
	if (!isShared() && trailStart < master()->trail().size()) {
		for (const LitVec& trail = master()->trail(); trailStart != trail.size(); ++trailStart) {
			Literal p = trail[trailStart];
			if (p.id() < btig_.size()) { btig_.removeTrue(*master(), p); }
		}
	}
	Solver::ConstraintDB& db = master()->constraints_;
	if (concurrency() == 1 || master()->dbIdx_ == 0) {
		Clasp::simplifyDB(*master(), db, shuffle);
	}
	else {
		uint32 rem = 0;
		for (Solver::ConstraintDB::size_type i = 0, end = db.size(); i != end; ++i) {
			Constraint* c = db[i];
			if (c->simplify(*master(), shuffle)) { c->destroy(master(), false); db[i] = 0; ++rem; }
		}
		if (rem) {
			for (SolverVec::size_type s = 1; s != solvers_.size(); ++s) {
				Solver& x = *solvers_[s];
				POTASSCO_ASSERT(x.dbIdx_ <= db.size(), "Invalid DB idx!");
				if      (x.dbIdx_ == db.size()) { x.dbIdx_ -= rem; }
				else if (x.dbIdx_ != 0)         { x.dbIdx_ -= (uint32)std::count_if(db.begin(), db.begin()+x.dbIdx_, IsNull()); }
			}
			db.erase(std::remove_if(db.begin(), db.end(), IsNull()), db.end());
		}
	}
	master()->dbIdx_ = sizeVec(db);
}